

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall
duckdb_parquet::Statistics::read(Statistics *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _func_int **pp_Var6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  TType ftype;
  string fname;
  ushort local_96;
  int local_94;
  string *local_90;
  string *local_88;
  int64_t *local_80;
  int64_t *local_78;
  string *local_70;
  string *local_68;
  bool *local_60;
  bool *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar2 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->is_min_value_exact;
  local_60 = &this->is_max_value_exact;
  local_68 = &this->min_value;
  local_70 = &this->max_value;
  local_78 = &this->distinct_count;
  local_80 = &this->null_count;
  local_88 = &this->min;
  local_90 = &this->max;
  do {
    iVar3 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_94,&local_96);
    if (local_94 == 0) {
      iVar4 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar3 + iVar2);
    }
    switch(local_96) {
    case 1:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_94 != 0xb) break;
      iVar4 = (*pp_Var6[0x2b])(this_00,local_90);
      bVar1 = 1;
LAB_01b9e9c9:
      this->__isset = (_Statistics__isset)((byte)this->__isset | bVar1);
      goto LAB_01b9e9e1;
    case 2:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_94 == 0xb) {
        iVar4 = (*pp_Var6[0x2b])(this_00,local_88);
        bVar1 = 2;
        goto LAB_01b9e9c9;
      }
      break;
    case 3:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_94 == 10) {
        iVar4 = (*pp_Var6[0x28])(this_00,local_80);
        bVar1 = 4;
        goto LAB_01b9e9c9;
      }
      break;
    case 4:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_94 == 10) {
        iVar4 = (*pp_Var6[0x28])(this_00,local_78);
        bVar1 = 8;
        goto LAB_01b9e9c9;
      }
      break;
    case 5:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_94 == 0xb) {
        iVar4 = (*pp_Var6[0x2b])(this_00,local_70);
        bVar1 = 0x10;
        goto LAB_01b9e9c9;
      }
      break;
    case 6:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_94 == 0xb) {
        iVar4 = (*pp_Var6[0x2b])(this_00,local_68);
        bVar1 = 0x20;
        goto LAB_01b9e9c9;
      }
      break;
    case 7:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_94 == 2) {
        iVar4 = (*pp_Var6[0x23])(this_00,local_60);
        bVar1 = 0x40;
        goto LAB_01b9e9c9;
      }
      break;
    case 8:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_94 == 2) {
        iVar4 = (*pp_Var6[0x23])(this_00,local_58);
        bVar1 = 0x80;
        goto LAB_01b9e9c9;
      }
      break;
    default:
      pp_Var6 = this_00->_vptr_TProtocol;
    }
    iVar4 = (*pp_Var6[0x2c])(this_00);
LAB_01b9e9e1:
    iVar5 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar2 = iVar4 + iVar3 + iVar2 + iVar5;
  } while( true );
}

Assistant:

uint32_t Statistics::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->max);
          this->__isset.max = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->min);
          this->__isset.min = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->null_count);
          this->__isset.null_count = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->distinct_count);
          this->__isset.distinct_count = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->max_value);
          this->__isset.max_value = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->min_value);
          this->__isset.min_value = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->is_max_value_exact);
          this->__isset.is_max_value_exact = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->is_min_value_exact);
          this->__isset.is_min_value_exact = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}